

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  uint uVar8;
  char *pcVar9;
  char *__format;
  ulong uVar10;
  long lVar11;
  cargo_test_t *pcVar12;
  cargo_t cargo;
  int all;
  int quiet;
  int shortlist;
  size_t test_name_count;
  char **test_names;
  int tests_to_run [169];
  byte local_311;
  cargo_t local_310;
  int local_308;
  int local_304;
  byte local_2fd;
  int local_2fc;
  ulong local_2f8;
  undefined8 local_2f0;
  long local_2e8;
  undefined8 local_2e0;
  uint local_2d8 [170];
  
  local_308 = 0;
  local_304 = 0;
  local_2fc = 0;
  local_2e8 = 0;
  local_2f8 = 0;
  memset(local_2d8,0,0x2a4);
  cargo_suppress_debug = 1;
  iVar3 = cargo_init(&local_310,CARGO_NOERR_OUTPUT|CARGO_AUTOCLEAN,*argv);
  if (iVar3 == 0) {
    cargo_set_description
              (local_310,"You can add additional debug output by compiling with CARGO_DEBUG=<level>"
              );
    iVar3 = cargo_add_option(local_310,0,"--shortlist --short -s",
                             "Only show the tests that have been run, don\'t include the entire list."
                             ,"b",&local_2fc);
    iVar4 = cargo_add_option(local_310,0,"--all -a","Run all tests.","b",&local_308);
    iVar5 = cargo_add_option(local_310,0,"--quiet -q","Suppress CARGO_DEBUG output.","b",&local_304)
    ;
    iVar6 = cargo_add_option(local_310,0,"tests",
                             "Either a test number or name. If -1 is specified all tests will be run."
                             ,"[s]*",&local_2e8,&local_2f8);
    cargo_set_epilog(local_310,
                     "Return code for this usage message equals the number of available tests.");
    if (iVar6 != 0 || (iVar5 != 0 || (iVar4 != 0 || iVar3 != 0))) {
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                    ,0x2fe5,"int main(int, char **)");
    }
    uVar10 = 1;
    iVar3 = cargo_parse(local_310,0,1,argc,argv);
    if (iVar3 == 0) {
      if ((local_2f8 != 0) || (local_308 != 0)) {
        if (local_304 == 0) {
          cargo_suppress_debug = 0;
        }
        if (local_2f8 == 0) {
          uVar10 = 0;
        }
        else {
          uVar10 = 0;
          do {
            pcVar7 = *(char **)(local_2e8 + uVar10 * 8);
            iVar3 = strncmp(pcVar7,"TEST_",5);
            if (iVar3 == 0) {
              uVar8 = 1;
              lVar11 = 0;
              do {
                iVar3 = strcmp(pcVar7,*(char **)((long)&tests[0].name + lVar11));
                if (iVar3 == 0) goto LAB_00110316;
                uVar8 = uVar8 + 1;
                lVar11 = lVar11 + 0x20;
              } while (lVar11 != 0x1520);
              uVar8 = 0xffffffff;
LAB_00110316:
              if ((int)uVar8 < 1) {
                pcVar9 = "Unknown test specified: \"%s\"\n";
LAB_001105aa:
                fprintf(_stderr,pcVar9,pcVar7);
                goto LAB_001105b1;
              }
            }
            else {
              uVar8 = atoi(pcVar7);
              fprintf(_stderr,"%d\n",(ulong)uVar8);
              if ((uVar8 == 0) || (0xa9 < (int)uVar8)) {
                pcVar7 = *(char **)(local_2e8 + uVar10 * 8);
                pcVar9 = "Invalid test number %s\n";
                goto LAB_001105aa;
              }
              if ((int)uVar8 < 0) {
                puts("Run ALL tests!");
                local_308 = 1;
                break;
              }
            }
            local_2d8[uVar10] = uVar8;
            uVar10 = uVar10 + 1;
          } while (uVar10 < local_2f8);
        }
        if (local_308 != 0) {
          lVar11 = 0;
          do {
            lVar1 = lVar11 + 1;
            local_2d8[lVar11] = (uint)lVar1;
            lVar11 = lVar1;
          } while (lVar1 != 0xa9);
          uVar10 = 0xa9;
        }
        if (uVar10 == 0) {
          local_311 = 1;
          local_2f0 = 0;
        }
        else {
          main_cold_4();
          local_2f0 = local_2e0;
          local_311 = local_2fd;
        }
        puts("---------------------------------------------------------------");
        puts("Test report:");
        puts("---------------------------------------------------------------");
        pcVar12 = tests;
        lVar11 = 0;
        do {
          if (pcVar12->ran == 0) {
            if (local_2fc == 0) {
              pcVar7 = pcVar12->name;
              __format = " [%sNOT RUN%s] %3lu: %s\n";
              pcVar9 = "^\x1b[01;30m";
              goto LAB_00110418;
            }
          }
          else if (pcVar12->success == 0) {
            main_cold_5();
          }
          else {
            pcVar7 = pcVar12->name;
            __format = " [%sSUCCESS%s] %3lu: %s\n";
            pcVar9 = "=\x1b[22;32m";
LAB_00110418:
            printf(__format,pcVar9 + 1,"\x1b[0m",lVar11 + 1,pcVar7);
          }
          lVar11 = lVar11 + 1;
          pcVar12 = pcVar12 + 1;
          if (lVar11 == 0xa9) {
            if ((local_311 & 1) == 0) {
              main_cold_6();
            }
            else {
              printf("\n[[%sSUCCESS%s]] ","\x1b[22;32m","\x1b[0m");
            }
            uVar2 = local_2f0;
            printf("%lu of %lu tests run were successful (%lu of %lu tests ran)\n",local_2f0,uVar10,
                   uVar10,0xa9);
            cargo_suppress_debug = 1;
            cargo_destroy(&local_310);
            if (local_304 == 0) {
              cargo_suppress_debug = 0;
            }
            return (int)uVar10 - (int)uVar2;
          }
        } while( true );
      }
      main_cold_3();
    }
    else {
      lVar11 = 0;
      do {
        printf("%2d: %s\n",uVar10,*(undefined8 *)((long)&tests[0].name + lVar11));
        lVar11 = lVar11 + 0x20;
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (lVar11 != 0x1520);
      cargo_fprint_usage(local_310,_stdout,CARGO_USAGE_FULL);
      if (local_310 == (cargo_t)0x0) {
        __assert_fail("ctx",
                      "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                      ,0x14f9,"const char *cargo_get_error(cargo_t)");
      }
      main_cold_2();
    }
LAB_001105b1:
    iVar3 = 0xa9;
  }
  else {
    main_cold_1();
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
    cargo_t cargo;
    size_t i;
    int was_error = 0;
    int tests_to_run[CARGO_NUM_TESTS];
    size_t num_tests = 0;
    size_t success_count = 0;
    int all = 0;
    int quiet = 0;
    int test_index = 0;
    int shortlist = 0;
    int start = 1;
    int ret = 0;
    char **test_names = NULL;
    size_t test_name_count = 0;
    cargo_test_t *t;

    memset(tests_to_run, 0, sizeof(tests_to_run));

    cargo_suppress_debug = 1;

    if (cargo_init(&cargo, CARGO_AUTOCLEAN | CARGO_NOERR_OUTPUT, argv[0]))
    {
        fprintf(stderr, "Failed to init command line parsing\n");
        return -1;
    }

    cargo_set_description(cargo,
        "You can add additional debug output by compiling with CARGO_DEBUG=<level>");

    ret |= cargo_add_option(cargo, 0, "--shortlist --short -s",
            "Only show the tests that have been run, don't include the entire list.",
            "b", &shortlist);

    ret |= cargo_add_option(cargo, 0, "--all -a",
            "Run all tests.",
            "b", &all);

    ret |= cargo_add_option(cargo, 0, "--quiet -q",
            "Suppress CARGO_DEBUG output.",
            "b", &quiet);

    ret |= cargo_add_option(cargo, 0, "tests",
            "Either a test number or name. "
            "If -1 is specified all tests will be run.",
            "[s]*", &test_names, &test_name_count);

    cargo_set_epilog(cargo,
            "Return code for this usage message equals "
            "the number of available tests.");

    assert(ret == 0);

    if (cargo_parse(cargo, 0, 1, argc, argv))
    {
        _test_print_names();
        cargo_print_usage(cargo, 0);
        fprintf(stderr, "%s\n", cargo_get_error(cargo));
        return CARGO_NUM_TESTS;
    }

    if ((test_name_count == 0) && !all)
    {
        _test_print_names();
        cargo_print_usage(cargo, 0);
        fprintf(stderr, "No test specified!\n");
        return CARGO_NUM_TESTS;
    }

    if (!quiet) cargo_suppress_debug = 0;

    for (i = 0; i < test_name_count; i++)
    {
        // First check if we were given a function name.
        if (!strncmp(test_names[i], "TEST_", 5))
        {
            test_index = _test_find_test_index(test_names[i]);

            if (test_index <= 0)
            {
                fprintf(stderr, "Unknown test specified: \"%s\"\n", test_names[i]);
                return CARGO_NUM_TESTS;
            }
        }
        else
        {
            test_index = atoi(test_names[i]);
            fprintf(stderr, "%d\n", test_index);

            if ((test_index == 0) || (test_index > (int)CARGO_NUM_TESTS))
            {
                fprintf(stderr, "Invalid test number %s\n", test_names[i]);
                return CARGO_NUM_TESTS;
            }
            else if (test_index < 0)
            {
                printf("Run ALL tests!\n");
                all = 1;
                break;
            }
        }

        tests_to_run[num_tests] = test_index;
        num_tests++;
    }

    // Run all tests.
    if (all)
    {
        num_tests = CARGO_NUM_TESTS;

        for (i = 0; i < num_tests; i++)
        {
            tests_to_run[i] = i + 1;
        }
    }

    // Run the tests.
    for (i = 0; i < num_tests; i++)
    {
        test_index = tests_to_run[i] - 1;
        t = &tests[test_index];
        t->ran = 1;

        fprintf(stderr, "\n%sStart Test %3d:%s - %s\n",
            CARGO_COLOR_CYAN, test_index + 1, CARGO_COLOR_RESET, t->name);

        //fprintf(stderr, "%s", CARGO_COLOR_DARK_GRAY);
        t->error = t->f();
        fprintf(stderr, "%s", CARGO_COLOR_RESET);

        fprintf(stderr, "%sEnd Test %3d:%s ",
            CARGO_COLOR_CYAN, test_index + 1, CARGO_COLOR_RESET);

        if (t->error)
        {
            fprintf(stderr, "[%sFAIL%s] %s\n",
                CARGO_COLOR_RED, CARGO_COLOR_RESET, t->error);
            was_error++;
        }
        else
        {
            fprintf(stderr, "[%sSUCCESS%s]\n",
                CARGO_COLOR_GREEN, CARGO_COLOR_RESET);

            success_count++;
        }

        tests[test_index].success = (t->error == NULL);
    }

    printf("---------------------------------------------------------------\n");
    printf("Test report:\n");
    printf("---------------------------------------------------------------\n");

    for (i = 0; i < CARGO_NUM_TESTS; i++)
    {
        if (!tests[i].ran)
        {
            if (!shortlist)
            {
                printf(" [%sNOT RUN%s] %3lu: %s\n",
                    CARGO_COLOR_DARK_GRAY, CARGO_COLOR_RESET, (i + 1), tests[i].name);
            }

            continue;
        }

        if (tests[i].success)
        {
            printf(" [%sSUCCESS%s] %3lu: %s\n",
                CARGO_COLOR_GREEN, CARGO_COLOR_RESET, (i + 1), tests[i].name);
        }
        else
        {
            fprintf(stderr, " [%sFAILED%s]  %3lu: %s - %s\n",
                CARGO_COLOR_RED, CARGO_COLOR_RESET,
                (i + 1), tests[i].name, tests[i].error);
        }
    }

    if (was_error)
    {
        fprintf(stderr, "\n[[%sFAIL%s]] ", CARGO_COLOR_RED, CARGO_COLOR_RESET);
    }
    else
    {
        printf("\n[[%sSUCCESS%s]] ", CARGO_COLOR_GREEN, CARGO_COLOR_RESET);
    }

    printf("%lu of %lu tests run were successful (%lu of %lu tests ran)\n",
            success_count, num_tests, num_tests, CARGO_NUM_TESTS);

    cargo_suppress_debug = 1;
    cargo_destroy(&cargo);
    if (!quiet) cargo_suppress_debug = 0;

    return (num_tests - success_count);
}